

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.hpp
# Opt level: O1

void __thiscall
ranges::
concat_view<ranges::single_view<double>,ranges::ref_view<std::vector<double,std::allocator<double>>>>
::cursor<false>::satisfy<0ul>(cursor<false> *this)

{
  undefined8 uVar1;
  double **ppdVar2;
  
  ppdVar2 = detail::_adl_get_::
            adl_get<0ul,ranges::variant<double*,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>&>
                      ((variant<double_*,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                        *)(this + 8));
  if (*ppdVar2 == (double *)(*(long *)this + 0x18)) {
    uVar1 = **(undefined8 **)(*(long *)this + 8);
    if (*(long *)(this + 0x10) != -1) {
      *(undefined8 *)(this + 0x10) = 0xffffffffffffffff;
    }
    *(undefined8 *)(this + 8) = uVar1;
    *(undefined8 *)(this + 0x10) = 1;
  }
  return;
}

Assistant:

void satisfy(meta::size_t<N>)
            {
                RANGES_EXPECT(its_.index() == N);
                if(ranges::get<N>(its_) == end(std::get<N>(rng_->rngs_)))
                {
                    ranges::emplace<N + 1>(its_, begin(std::get<N + 1>(rng_->rngs_)));
                    this->satisfy(meta::size_t<N + 1>{});
                }
            }